

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O0

int lws_tls_cert_updated
              (lws_context *context,char *certpath,char *keypath,char *mem_cert,size_t len_mem_cert,
              char *mem_privkey,size_t len_mem_privkey)

{
  int iVar1;
  lws_context *local_4d8;
  lws_vhost *v;
  lws wsi;
  char *mem_privkey_local;
  size_t len_mem_cert_local;
  char *mem_cert_local;
  char *keypath_local;
  char *certpath_local;
  lws_context *context_local;
  
  v = (lws_vhost *)context;
  wsi._1168_8_ = mem_privkey;
  for (local_4d8 = (lws_context *)context->vhost_list; local_4d8 != (lws_context *)0x0;
      local_4d8 = *(lws_context **)((long)&(local_4d8->smd).lock_messages + 8)) {
    wsi.a.context = local_4d8;
    if ((((local_4d8->pt[0].pt_sul_owner[1].head != (lws_dll2 *)0x0) &&
         (*(long *)&local_4d8->pt[0].pt_sul_owner[1].count != 0)) &&
        (iVar1 = strcmp((char *)local_4d8->pt[0].pt_sul_owner[1].head,certpath), iVar1 == 0)) &&
       ((iVar1 = strcmp(*(char **)&local_4d8->pt[0].pt_sul_owner[1].count,keypath), iVar1 == 0 &&
        (lws_tls_server_certs_load
                   ((lws_vhost *)local_4d8,(lws *)&v,certpath,keypath,mem_cert,len_mem_cert,
                    (char *)wsi._1168_8_,len_mem_privkey),
        (*(byte *)((long)&local_4d8->pt[0].sul_tls.list.prev + 4) >> 1 & 1) != 0)))) {
      _lws_log(4,"%s: vhost %s: cert unset\n","lws_tls_cert_updated",
               (local_4d8->smd).owner_peers.head);
    }
  }
  return 0;
}

Assistant:

int
lws_tls_cert_updated(struct lws_context *context, const char *certpath,
		     const char *keypath,
		     const char *mem_cert, size_t len_mem_cert,
		     const char *mem_privkey, size_t len_mem_privkey)
{
	struct lws wsi;

	wsi.a.context = context;

	lws_start_foreach_ll(struct lws_vhost *, v, context->vhost_list) {
		wsi.a.vhost = v; /* not a real bound wsi */
		if (v->tls.alloc_cert_path && v->tls.key_path &&
		    !strcmp(v->tls.alloc_cert_path, certpath) &&
		    !strcmp(v->tls.key_path, keypath)) {
			lws_tls_server_certs_load(v, &wsi, certpath, keypath,
						  mem_cert, len_mem_cert,
						  mem_privkey, len_mem_privkey);

			if (v->tls.skipped_certs)
				lwsl_notice("%s: vhost %s: cert unset\n",
					    __func__, v->name);
		}
	} lws_end_foreach_ll(v, vhost_next);

	return 0;
}